

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

boolean compress_first_pass(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  undefined2 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  boolean bVar5;
  long lVar6;
  long lVar7;
  long in_RSI;
  long in_RDI;
  JBLOCKROW lastblockrow;
  JBLOCKROW thisblockrow;
  JBLOCKARRAY buffer;
  jpeg_component_info *compptr;
  JCOEF lastDC;
  int ndummy;
  int block_rows;
  int block_row;
  int h_samp_factor;
  int ci;
  int bi;
  JDIMENSION MCUindex;
  JDIMENSION MCUs_across;
  JDIMENSION blocks_across;
  JDIMENSION last_iMCU_row;
  my_coef_ptr coef;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  void *in_stack_ffffffffffffff90;
  long local_68;
  long local_60;
  long local_50;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_30;
  int local_2c;
  uint local_28;
  uint in_stack_ffffffffffffffe0;
  j_compress_ptr cinfo_00;
  
  cinfo_00 = *(j_compress_ptr *)(in_RDI + 0x1c8);
  uVar3 = *(int *)(in_RDI + 0x140) - 1;
  local_30 = 0;
  local_50 = *(long *)(in_RDI + 0x58);
  for (; local_30 < *(int *)(in_RDI + 0x4c); local_30 = local_30 + 1) {
    lVar6 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                      (in_RDI,cinfo_00->quant_tbl_ptrs[(long)local_30 + 2],
                       *(int *)&cinfo_00->progress * *(int *)(local_50 + 0xc),
                       *(undefined4 *)(local_50 + 0xc),1);
    if (*(uint *)&cinfo_00->progress < uVar3) {
      local_3c = *(uint *)(local_50 + 0xc);
    }
    else {
      local_3c = *(uint *)(local_50 + 0x20) % *(uint *)(local_50 + 0xc);
      if (local_3c == 0) {
        local_3c = *(uint *)(local_50 + 0xc);
      }
    }
    uVar2 = *(uint *)(local_50 + 8);
    local_40 = *(uint *)(local_50 + 0x1c) % uVar2;
    if (0 < (int)local_40) {
      local_40 = uVar2 - local_40;
    }
    in_stack_ffffffffffffffe0 = *(uint *)(local_50 + 0x1c);
    for (local_38 = 0; (int)local_38 < (int)local_3c; local_38 = local_38 + 1) {
      lVar7 = *(long *)(lVar6 + (long)(int)local_38 * 8);
      uVar4 = in_stack_ffffffffffffffe0;
      (**(code **)(*(long *)(in_RDI + 0x1e8) + 8))
                (in_RDI,local_50,*(undefined8 *)(in_RSI + (long)local_30 * 8),lVar7,local_38 << 3,0)
      ;
      if (0 < (int)local_40) {
        lVar7 = lVar7 + (ulong)uVar4 * 0x80;
        jzero_far(in_stack_ffffffffffffff90,
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffffe0));
        uVar1 = *(undefined2 *)(lVar7 + -0x80);
        for (local_2c = 0; local_2c < (int)local_40; local_2c = local_2c + 1) {
          *(undefined2 *)(lVar7 + (long)local_2c * 0x80) = uVar1;
        }
      }
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffffe0;
      in_stack_ffffffffffffffe0 = uVar4;
    }
    if (*(uint *)&cinfo_00->progress == uVar3) {
      in_stack_ffffffffffffffe0 = local_40 + in_stack_ffffffffffffffe0;
      uVar4 = in_stack_ffffffffffffffe0 / uVar2;
      for (local_38 = local_3c; (int)local_38 < *(int *)(local_50 + 0xc); local_38 = local_38 + 1) {
        local_60 = *(long *)(lVar6 + (long)(int)local_38 * 8);
        local_68 = *(long *)(lVar6 + (long)(int)(local_38 - 1) * 8);
        jzero_far(in_stack_ffffffffffffff90,
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        for (local_28 = 0; local_28 < uVar4; local_28 = local_28 + 1) {
          uVar1 = *(undefined2 *)(local_68 + (long)(int)(uVar2 - 1) * 0x80);
          for (local_2c = 0; local_2c < (int)uVar2; local_2c = local_2c + 1) {
            *(undefined2 *)(local_60 + (long)local_2c * 0x80) = uVar1;
          }
          local_60 = local_60 + (long)(int)uVar2 * 0x80;
          local_68 = local_68 + (long)(int)uVar2 * 0x80;
        }
      }
    }
    local_50 = local_50 + 0x60;
  }
  bVar5 = compress_output(cinfo_00,(JSAMPIMAGE)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  return bVar5;
}

Assistant:

METHODDEF(boolean)
compress_first_pass(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION blocks_across, MCUs_across, MCUindex;
  int bi, ci, h_samp_factor, block_row, block_rows, ndummy;
  JCOEF lastDC;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  JBLOCKROW thisblockrow, lastblockrow;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[ci],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (coef->iMCU_row_num < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here, since may not be set! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    blocks_across = compptr->width_in_blocks;
    h_samp_factor = compptr->h_samp_factor;
    /* Count number of dummy blocks to be added at the right margin. */
    ndummy = (int)(blocks_across % h_samp_factor);
    if (ndummy > 0)
      ndummy = h_samp_factor - ndummy;
    /* Perform DCT for all non-dummy blocks in this iMCU row.  Each call
     * on forward_DCT processes a complete horizontal row of DCT blocks.
     */
    for (block_row = 0; block_row < block_rows; block_row++) {
      thisblockrow = buffer[block_row];
      (*cinfo->fdct->forward_DCT) (cinfo, compptr,
                                   input_buf[ci], thisblockrow,
                                   (JDIMENSION)(block_row * DCTSIZE),
                                   (JDIMENSION)0, blocks_across);
      if (ndummy > 0) {
        /* Create dummy blocks at the right edge of the image. */
        thisblockrow += blocks_across; /* => first dummy block */
        jzero_far((void *)thisblockrow, ndummy * sizeof(JBLOCK));
        lastDC = thisblockrow[-1][0];
        for (bi = 0; bi < ndummy; bi++) {
          thisblockrow[bi][0] = lastDC;
        }
      }
    }
    /* If at end of image, create dummy block rows as needed.
     * The tricky part here is that within each MCU, we want the DC values
     * of the dummy blocks to match the last real block's DC value.
     * This squeezes a few more bytes out of the resulting file...
     */
    if (coef->iMCU_row_num == last_iMCU_row) {
      blocks_across += ndummy;  /* include lower right corner */
      MCUs_across = blocks_across / h_samp_factor;
      for (block_row = block_rows; block_row < compptr->v_samp_factor;
           block_row++) {
        thisblockrow = buffer[block_row];
        lastblockrow = buffer[block_row - 1];
        jzero_far((void *)thisblockrow,
                  (size_t)(blocks_across * sizeof(JBLOCK)));
        for (MCUindex = 0; MCUindex < MCUs_across; MCUindex++) {
          lastDC = lastblockrow[h_samp_factor - 1][0];
          for (bi = 0; bi < h_samp_factor; bi++) {
            thisblockrow[bi][0] = lastDC;
          }
          thisblockrow += h_samp_factor; /* advance to next MCU in row */
          lastblockrow += h_samp_factor;
        }
      }
    }
  }
  /* NB: compress_output will increment iMCU_row_num if successful.
   * A suspension return will result in redoing all the work above next time.
   */

  /* Emit data to the entropy encoder, sharing code with subsequent passes */
  return compress_output(cinfo, input_buf);
}